

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O3

void child_function(void)

{
  fdb_kvs_handle *handle;
  size_t keylen;
  size_t valuelen;
  int iVar1;
  ulong uVar2;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  char keybuf [256];
  fdb_config fconfig;
  char bodybuf [512];
  fdb_kvs_handle *local_460;
  fdb_file_handle *local_458;
  fdb_kvs_config local_450;
  char local_438 [264];
  fdb_config local_330;
  char local_238 [520];
  
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  local_330.block_reusing_threshold = 0x41;
  local_330.num_keeping_headers = 5;
  fdb_open(&local_458,"./staleblktest1",&local_330);
  fdb_kvs_open(local_458,&local_460,"db",&local_450);
  iVar1 = 0;
  uVar2 = 0;
  do {
    sprintf(local_438,"key%d",uVar2);
    sprintf(local_238,"seqno%d",uVar2);
    handle = local_460;
    keylen = strlen(local_438);
    valuelen = strlen(local_238);
    fdb_set_kv(handle,local_438,keylen,local_238,valuelen);
    if ((int)(uVar2 / 100) * 100 + iVar1 == 0) {
      fdb_commit(local_458,(int)(uVar2 / 500) * 500 + iVar1 == 0);
    }
    uVar2 = (ulong)((int)uVar2 + 1);
    iVar1 = iVar1 + -1;
  } while( true );
}

Assistant:

void child_function() {
    int i;
    char keybuf[256];
    char bodybuf[512];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.block_reusing_threshold = 65;
    fconfig.num_keeping_headers = 5;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db", &kvs_config);

    // load docs into db and db2
    i = 0;
    while (true) {
        sprintf(keybuf, "key%d",i);
        sprintf(bodybuf, "seqno%d",i);
        fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        // create seqno every 100 updates
        if ((i % 100) == 0) {
            if ((i % 500) == 0) { // wal flush every 500 updates
                fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
            } else {
                fdb_commit(dbfile, FDB_COMMIT_NORMAL);
            }
        }
        i++;
    }
}